

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O1

void __thiscall
t_java_generator::generate_javax_generated_annotation(t_java_generator *this,ostream *out)

{
  _func_int *p_Var1;
  code cVar2;
  tm *ptVar3;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  time_t seconds;
  time_t local_50;
  char *local_48;
  long local_40;
  char local_38 [16];
  
  local_50 = time((time_t *)0x0);
  ptVar3 = localtime(&local_50);
  poVar4 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"@javax.annotation.Generated(value = \"",0x25);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1d])(&local_48,this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_48,local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  if (this->undated_generated_annotations_ == true) {
    pcVar6 = ")";
    lVar5 = 1;
  }
  else {
    poVar4 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", date = \"",10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,ptVar3->tm_year + 0x76c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"-",1);
    p_Var1 = (_func_int *)
             ((long)&poVar4->_vptr_basic_ostream + (long)poVar4->_vptr_basic_ostream[-3]);
    if ((&poVar4->field_0xe1)[(long)poVar4->_vptr_basic_ostream[-3]] == '\0') {
      cVar2 = (code)std::ios::widen((char)p_Var1);
      p_Var1[0xe0] = cVar2;
      p_Var1[0xe1] = (code)0x1;
    }
    p_Var1[0xe0] = (code)0x30;
    *(undefined8 *)(&poVar4->field_0x10 + (long)poVar4->_vptr_basic_ostream[-3]) = 2;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,ptVar3->tm_mon + 1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"-",1);
    p_Var1 = (_func_int *)
             ((long)&poVar4->_vptr_basic_ostream + (long)poVar4->_vptr_basic_ostream[-3]);
    if ((&poVar4->field_0xe1)[(long)poVar4->_vptr_basic_ostream[-3]] == '\0') {
      cVar2 = (code)std::ios::widen((char)p_Var1);
      p_Var1[0xe0] = cVar2;
      p_Var1[0xe1] = (code)0x1;
    }
    p_Var1[0xe0] = (code)0x30;
    *(undefined8 *)(&poVar4->field_0x10 + (long)poVar4->_vptr_basic_ostream[-3]) = 2;
    out = (ostream *)std::ostream::operator<<(poVar4,ptVar3->tm_mday);
    pcVar6 = "\")";
    lVar5 = 2;
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar6,lVar5);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_java_generator::generate_javax_generated_annotation(ostream& out) {
  time_t seconds = time(nullptr);
  struct tm* now = localtime(&seconds);
  indent(out) << "@javax.annotation.Generated(value = \"" << autogen_summary() << "\"";
  if (undated_generated_annotations_) {
    out << ")" << endl;
  } else {
    indent(out) << ", date = \"" << (now->tm_year + 1900) << "-" << setfill('0') << setw(2)
                << (now->tm_mon + 1) << "-" << setfill('0') << setw(2) << now->tm_mday
                << "\")" << endl;
  }
}